

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterLoadNPos(Fts5Index *p,Fts5SegIter *pIter)

{
  byte bVar1;
  int iVar2;
  int local_28;
  uint local_24 [2];
  int nSz;
  int iEod;
  int iOff;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  if (p->rc == 0) {
    nSz = pIter->iLeafOffset;
    _iEod = pIter;
    if (p->pConfig->eDetail == 1) {
      if (pIter->iEndofDoclist < pIter->pLeaf->szLeaf) {
        local_28 = pIter->iEndofDoclist;
      }
      else {
        local_28 = pIter->pLeaf->szLeaf;
      }
      pIter->bDel = '\0';
      pIter->nPos = 1;
      if ((nSz < local_28) && (pIter->pLeaf->p[nSz] == '\0')) {
        pIter->bDel = '\x01';
        iVar2 = nSz + 1;
        if ((iVar2 < local_28) && (pIter->pLeaf->p[iVar2] == '\0')) {
          pIter->nPos = 1;
          nSz = nSz + 2;
        }
        else {
          pIter->nPos = 0;
          nSz = iVar2;
        }
      }
    }
    else {
      bVar1 = pIter->pLeaf->p[nSz];
      local_24[0] = (uint)bVar1;
      iVar2 = nSz + 1;
      if ((bVar1 & 0x80) != 0) {
        pIter_local = (Fts5SegIter *)p;
        iVar2 = sqlite3Fts5GetVarint32(pIter->pLeaf->p + nSz,local_24);
        iVar2 = iVar2 + nSz;
      }
      nSz = iVar2;
      _iEod->bDel = (byte)local_24[0] & 1;
      _iEod->nPos = (int)local_24[0] >> 1;
    }
    _iEod->iLeafOffset = nSz;
  }
  return;
}

Assistant:

static void fts5SegIterLoadNPos(Fts5Index *p, Fts5SegIter *pIter){
  if( p->rc==SQLITE_OK ){
    int iOff = pIter->iLeafOffset;  /* Offset to read at */
    ASSERT_SZLEAF_OK(pIter->pLeaf);
    if( p->pConfig->eDetail==FTS5_DETAIL_NONE ){
      int iEod = MIN(pIter->iEndofDoclist, pIter->pLeaf->szLeaf);
      pIter->bDel = 0;
      pIter->nPos = 1;
      if( iOff<iEod && pIter->pLeaf->p[iOff]==0 ){
        pIter->bDel = 1;
        iOff++;
        if( iOff<iEod && pIter->pLeaf->p[iOff]==0 ){
          pIter->nPos = 1;
          iOff++;
        }else{
          pIter->nPos = 0;
        }
      }
    }else{
      int nSz;
      fts5FastGetVarint32(pIter->pLeaf->p, iOff, nSz);
      pIter->bDel = (nSz & 0x0001);
      pIter->nPos = nSz>>1;
      assert_nc( pIter->nPos>=0 );
    }
    pIter->iLeafOffset = iOff;
  }
}